

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  uint uVar3;
  Type TVar4;
  int iVar5;
  hash_t hVar6;
  EntryType *dst;
  uint min;
  long lVar7;
  long lVar8;
  int *piVar9;
  undefined8 local_78 [2];
  undefined8 local_68;
  undefined8 uStack_60;
  BaseDictionary<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *local_58;
  uint local_4c;
  Type local_48;
  int *newBuckets;
  int local_38;
  uint local_34;
  int modIndex;
  
  uVar3 = this->count * 2;
  local_38 = 0x4b;
  min = 4;
  if (8 < uVar3) {
    min = this->count & 0x7fffffff;
  }
  local_34 = PrimePolicy::GetPrime(min,&local_38);
  local_48.ptr = (int *)0x0;
  newBuckets = (int *)0x0;
  if (local_34 == this->bucketCount) {
    dst = AllocateEntries(this,uVar3,true);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<Js::EvalMapStringInternal<true>,Memory::WriteBarrierPtr<Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>>>,Memory::WriteBarrierPtr<Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>>,Memory::RecyclerNonLeafAllocator>
              (dst,(long)(int)uVar3,(this->entries).ptr,(long)this->count);
    DeleteEntries(this,(this->entries).ptr,this->size);
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr = dst;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->size = uVar3;
    this->modFunctionIndex = local_38;
  }
  else {
    Allocate(this,&local_48.ptr,(EntryType **)&newBuckets,local_34,uVar3);
    local_4c = uVar3;
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<Js::EvalMapStringInternal<true>,Memory::WriteBarrierPtr<Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>>>,Memory::WriteBarrierPtr<Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>>,Memory::RecyclerNonLeafAllocator>
              ((SimpleDictionaryEntry<Js::EvalMapStringInternal<true>,_Memory::WriteBarrierPtr<Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_>_>
                *)newBuckets,(long)(int)uVar3,(this->entries).ptr,(long)this->count);
    this->modFunctionIndex = local_38;
    iVar5 = this->count;
    if (0 < iVar5) {
      lVar7 = 0;
      lVar8 = 0;
      piVar9 = newBuckets;
      local_58 = this;
      do {
        if (-2 < *(int *)((long)piVar9 + lVar7 + 8)) {
          uVar2 = *(undefined8 *)((long)piVar9 + lVar7 + 0x18);
          Memory::Recycler::WBSetBit((char *)local_78);
          local_78[0] = uVar2;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(local_78);
          this = local_58;
          puVar1 = (undefined8 *)((long)piVar9 + lVar7 + 0x28);
          local_68 = *puVar1;
          uStack_60 = puVar1[1];
          hVar6 = PrimePolicy::ModPrime((uint)local_68 >> 1,local_34,local_58->modFunctionIndex);
          *(int *)((long)newBuckets + lVar7 + 8) = local_48.ptr[(int)hVar6];
          local_48.ptr[(int)hVar6] = (int)lVar8;
          iVar5 = this->count;
          piVar9 = newBuckets;
        }
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 0x38;
      } while (lVar8 < iVar5);
    }
    DeleteBuckets(this,(this->buckets).ptr,this->bucketCount);
    DeleteEntries(this,(this->entries).ptr,this->size);
    uVar3 = local_4c;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,local_4c,local_4c - this->size);
    }
    TVar4.ptr = local_48.ptr;
    Memory::Recycler::WBSetBit((char *)this);
    (this->buckets).ptr = TVar4.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    piVar9 = newBuckets;
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr =
         (SimpleDictionaryEntry<Js::EvalMapStringInternal<true>,_Memory::WriteBarrierPtr<Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_>_>
          *)piVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->bucketCount = local_34;
    this->size = uVar3;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }